

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p2sc_fits.c
# Opt level: O0

sfts_t * sfts_create(char *name,char *tmpl)

{
  char *pcVar1;
  long in_RSI;
  long in_RDI;
  char *_base;
  char _msg [31];
  p2sc_iofile_t *io;
  char card [81];
  char msg [31];
  char *line;
  int st;
  int t;
  int *s;
  sfts_t *f;
  int *in_stack_00000120;
  int *in_stack_00000128;
  char *in_stack_00000130;
  char *in_stack_00000138;
  char *in_stack_fffffffffffffef8;
  int in_stack_ffffffffffffff04;
  undefined8 local_f8;
  int *in_stack_ffffffffffffff10;
  _func_void_ptr_void_ptr_size_t *in_stack_ffffffffffffff18;
  p2sc_iofile_t *in_stack_ffffffffffffff20;
  size_t *in_stack_ffffffffffffff28;
  undefined6 in_stack_ffffffffffffff30;
  undefined1 in_stack_ffffffffffffff36;
  undefined1 in_stack_ffffffffffffff37;
  fitsfile **in_stack_ffffffffffffff38;
  char local_b8 [16];
  int *in_stack_ffffffffffffff58;
  char *in_stack_ffffffffffffff60;
  fitsfile *in_stack_ffffffffffffff68;
  undefined1 local_58 [30];
  undefined1 local_3a;
  char *local_30;
  int local_28;
  int *local_20;
  sfts_t *local_18;
  long local_10;
  long local_8;
  
  local_10 = in_RSI;
  local_8 = in_RDI;
  local_18 = (sfts_t *)g_malloc0(0x28);
  local_20 = &local_18->stat;
  if (local_8 != 0) {
    pcVar1 = (char *)g_strdup(local_8);
    local_18->name = pcVar1;
  }
  ffimem(in_stack_ffffffffffffff38,
         (void **)CONCAT17(in_stack_ffffffffffffff37,
                           CONCAT16(in_stack_ffffffffffffff36,in_stack_ffffffffffffff30)),
         in_stack_ffffffffffffff28,(size_t)in_stack_ffffffffffffff20,in_stack_ffffffffffffff18,
         in_stack_ffffffffffffff10);
  if (local_10 != 0) {
    local_28 = 0;
    p2sc_open_iofile((char *)in_stack_ffffffffffffff18,(char *)in_stack_ffffffffffffff10);
    while (local_30 = p2sc_read_line(in_stack_ffffffffffffff20), local_30 != (char *)0x0) {
      memset(local_b8,0,0x51);
      ffgthd(in_stack_00000138,in_stack_00000130,in_stack_00000128,in_stack_00000120);
      if (local_28 != 0) {
        ffgerr(in_stack_ffffffffffffff04,in_stack_fffffffffffffef8);
        local_3a = 0;
        _p2sc_msg("sfts_create",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Helioviewer-Project[P]fits2img/libsidc/libp2sc/p2sc_fits.c"
                  ,0xcb,"$Id: p2sc_fits.c 5204 2015-04-30 19:12:42Z bogdan $",0x12c0,
                  "%s: error parsing: %s - %s",local_10,local_30,local_58);
        exit(1);
      }
      g_free(local_30);
      if (local_b8[0] != '\0') {
        ffprec(in_stack_ffffffffffffff68,in_stack_ffffffffffffff60,in_stack_ffffffffffffff58);
      }
    }
    p2sc_free_iofile((p2sc_iofile_t *)0x10873a);
  }
  if ((local_18 != (sfts_t *)0x0) && (local_18->stat != 0)) {
    if (local_18->name == (char *)0x0) {
      local_f8 = g_strdup("memory");
    }
    else {
      local_f8 = g_path_get_basename(local_18->name);
    }
    ffgerr(in_stack_ffffffffffffff04,in_stack_fffffffffffffef8);
    _p2sc_msg("sfts_create",
              "/workspace/llm4binary/github/license_all_cmakelists_25/Helioviewer-Project[P]fits2img/libsidc/libp2sc/p2sc_fits.c"
              ,0xd6,"$Id: p2sc_fits.c 5204 2015-04-30 19:12:42Z bogdan $",0x11f8,"FITS: %s: %s",
              &stack0xffffffffffffff18,local_f8);
    exit(1);
  }
  return local_18;
}

Assistant:

sfts_t *sfts_create(const char *name, const char *tmpl) {
    sfts_t *f = (sfts_t *) g_malloc0(sizeof *f);
    int *s = &f->stat;

    if (name)
        f->name = g_strdup(name);
    fits_create_memfile(&f->fts, &f->ptr, &f->size, 0, g_realloc, s);

    if (tmpl) {
        int t, st = 0;
        char *line, msg[31], card[SKEY_LEN];
        p2sc_iofile_t *io = p2sc_open_iofile(tmpl, "r");

        while ((line = p2sc_read_line(io))) {
            memset(card, 0, sizeof card);
            fits_parse_template(line, card, &t, &st);
            if (st) {
                fits_get_errstatus(st, msg);
                msg[30] = 0;
                P2SC_Msg(LVL_FATAL_INTERNAL_ERROR, "%s: error parsing: %s - %s", tmpl, line, msg);
            }
            g_free(line);

            if (card[0]) {
                card[80] = 0;
                fits_write_record(f->fts, card, s);
            }
        }
        p2sc_free_iofile(io);
    }
    CHK_FTS(f);

    return f;
}